

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::FileHasSignature(char *filename,char *signature,long offset)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  char *__s1;
  size_t sVar2;
  bool bVar3;
  allocator<char> local_49;
  char *local_48 [4];
  
  if (signature != (char *)0x0 && filename != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,filename,&local_49);
    __stream = fopen(local_48[0],"rb");
    std::__cxx11::string::~string((string *)local_48);
    if (__stream != (FILE *)0x0) {
      bVar3 = false;
      fseek(__stream,offset,0);
      __n = strlen(signature);
      __s1 = (char *)operator_new__(__n);
      sVar2 = fread(__s1,1,__n,__stream);
      if (sVar2 == __n) {
        iVar1 = strncmp(__s1,signature,__n);
        bVar3 = iVar1 == 0;
      }
      operator_delete__(__s1);
      fclose(__stream);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool SystemTools::FileHasSignature(const char* filename, const char* signature,
                                   long offset)
{
  if (!filename || !signature) {
    return false;
  }

  FILE* fp = Fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  fseek(fp, offset, SEEK_SET);

  bool res = false;
  size_t signature_len = strlen(signature);
  char* buffer = new char[signature_len];

  if (fread(buffer, 1, signature_len, fp) == signature_len) {
    res = (!strncmp(buffer, signature, signature_len) ? true : false);
  }

  delete[] buffer;

  fclose(fp);
  return res;
}